

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_load_from_memory_name(loader_impl impl,char *name,char *buffer,size_t size)

{
  int iVar1;
  hash hVar2;
  ulong uVar3;
  undefined8 in_RCX;
  hash_key in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  size_t written;
  size_t length;
  hash h;
  int local_4;
  
  hVar2 = hash_callback_str(in_RDX);
  iVar1 = snprintf((char *)0x0,0,"%p-%p-%zu-%u",in_RDI,in_RDX,in_RCX,(int)hVar2);
  uVar3 = (ulong)iVar1;
  if (((uVar3 == 0) || (0xfe < uVar3)) ||
     (iVar1 = snprintf(in_RSI,uVar3 + 1,"%p-%p-%zu-%u",in_RDI,in_RDX,in_RCX,(int)hVar2),
     (long)iVar1 != uVar3)) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int loader_impl_load_from_memory_name(loader_impl impl, loader_name name, const char *buffer, size_t size)
{
	/* TODO: Improve name with time or uuid */
	static const char format[] = "%p-%p-%" PRIuS "-%u";

	hash h = hash_callback_str((const hash_key)buffer);

	size_t length = snprintf(NULL, 0, format, (const void *)impl, (const void *)buffer, size, (unsigned int)h);

	if (length > 0 && length < LOADER_NAME_SIZE)
	{
		size_t written = snprintf(name, length + 1, format, (const void *)impl, (const void *)buffer, size, (unsigned int)h);

		if (written == length)
		{
			return 0;
		}
	}

	return 1;
}